

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

char * mp::SkipToMatchingQuote(char *s)

{
  char quote;
  char *s_local;
  
  for (s_local = s + 1; *s_local != *s; s_local = s_local + 1) {
  }
  return s_local + 1;
}

Assistant:

const char* SkipToMatchingQuote(const char* s) {
  assert((*s == '\'') || (*s == '"'));
  char quote = s[0];
  ++s;
  while (*s != quote)
    ++s;
  return ++s;
}